

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O2

int kvtree_exchange_sendq(kvtree *send_hash,int rank,kvtree *msg)

{
  kvtree *pkVar1;
  
  pkVar1 = kvtree_getf(send_hash,"%d",rank);
  if (pkVar1 == (kvtree *)0x0) {
    pkVar1 = kvtree_new();
    kvtree_merge(pkVar1,msg);
    kvtree_setf(send_hash,pkVar1,"%d",rank);
  }
  else {
    kvtree_merge(pkVar1,msg);
  }
  return 0;
}

Assistant:

int kvtree_exchange_sendq(kvtree* send_hash, int rank, const kvtree* msg)
{
  /* see whether we've already got data for this rank,
   * if so, merge it in, otherwise create a copy and add it */
  kvtree* hash = kvtree_getf(send_hash, "%d", rank);
  if (hash == NULL) {
    /* no hash going to this rank yet, make a copy of the message and attach it */
    kvtree* copy = kvtree_new();
    kvtree_merge(copy, msg);
    kvtree_setf(send_hash, copy, "%d", rank);
  } else {
    /* got something already, just merge this message with outgoing data */
    kvtree_merge(hash, msg);
  }
  return KVTREE_SUCCESS;
}